

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)

{
  mbedtls_cipher_context_t *ctx;
  uchar *puVar1;
  uchar *buf;
  mbedtls_md_type_t mVar2;
  uint uVar3;
  mbedtls_ssl_session *pmVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  mbedtls_ssl_transform *pmVar6;
  _func_int_void_ptr_uchar_ptr_uchar_ptr_size_t_size_t_size_t *p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uchar *key;
  uchar *key_00;
  uchar *key_01;
  byte bVar11;
  int iVar12;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *md_info;
  code *pcVar13;
  int line;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  size_t __n;
  mbedtls_cipher_context_t *ctx_00;
  uchar *puVar20;
  uchar *key_02;
  uchar keyblk [256];
  uchar tmp [64];
  
  pmVar4 = ssl->session_negotiate;
  pmVar5 = ssl->handshake;
  pmVar6 = ssl->transform_negotiate;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1f5,"=> derive keys");
  cipher_info = mbedtls_cipher_info_from_type(pmVar6->ciphersuite_info->cipher);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    mVar2 = pmVar6->ciphersuite_info->cipher;
    pcVar19 = "cipher info for %d not found";
    iVar12 = 0x1fb;
LAB_0011032d:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar12,pcVar19,(ulong)mVar2);
    return -0x7100;
  }
  md_info = mbedtls_md_info_from_type(pmVar6->ciphersuite_info->mac);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    mVar2 = pmVar6->ciphersuite_info->mac;
    pcVar19 = "mbedtls_md info for %d not found";
    iVar12 = 0x203;
    goto LAB_0011032d;
  }
  if (ssl->minor_ver < 3) {
    pmVar5->tls_prf = tls1_prf;
    pmVar5->calc_verify = ssl_calc_verify_tls;
    pcVar13 = ssl_calc_finished_tls;
  }
  else {
    if (ssl->minor_ver != 3) {
      iVar12 = 0x232;
      goto LAB_00110444;
    }
    if (pmVar6->ciphersuite_info->mac == MBEDTLS_MD_SHA384) {
      pmVar5->tls_prf = tls_prf_sha384;
      pmVar5->calc_verify = ssl_calc_verify_tls_sha384;
      pcVar13 = ssl_calc_finished_tls_sha384;
    }
    else {
      pmVar5->tls_prf = tls_prf_sha256;
      pmVar5->calc_verify = ssl_calc_verify_tls_sha256;
      pcVar13 = ssl_calc_finished_tls_sha256;
    }
  }
  pmVar5->calc_finished = pcVar13;
  if (pmVar5->resume == 0) {
    puVar1 = pmVar5->premaster;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x243,"premaster secret",puVar1,pmVar5->pmslen);
    if (ssl->handshake->extended_ms == 1) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x24b,"using extended master secret");
      (*ssl->handshake->calc_verify)(ssl,keyblk);
      if (ssl->minor_ver == 3) {
        sVar16 = (ulong)(ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384) << 4
                 | 0x20;
      }
      else {
        sVar16 = 0x24;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x260,"session hash",keyblk,sVar16);
      iVar12 = (*pmVar5->tls_prf)(puVar1,pmVar5->pmslen,"extended master secret",keyblk,sVar16,
                                  pmVar4->master,0x30);
      if (iVar12 != 0) {
        pcVar19 = "prf";
        line = 0x268;
        goto LAB_001102e4;
      }
    }
    else {
      iVar12 = (*pmVar5->tls_prf)(puVar1,pmVar5->pmslen,"master secret",pmVar5->randbytes,0x40,
                                  pmVar4->master,0x30);
      if (iVar12 != 0) {
        pcVar19 = "prf";
        line = 0x275;
        goto LAB_001102e4;
      }
    }
    mbedtls_zeroize(puVar1,0x424);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x27c,"no premaster (session resumed)");
  }
  puVar1 = pmVar5->randbytes;
  tmp._0_8_ = *(undefined8 *)pmVar5->randbytes;
  tmp._8_8_ = *(undefined8 *)(pmVar5->randbytes + 8);
  tmp._16_8_ = *(undefined8 *)(pmVar5->randbytes + 0x10);
  tmp._24_8_ = *(undefined8 *)(pmVar5->randbytes + 0x18);
  tmp._32_8_ = *(undefined8 *)(pmVar5->randbytes + 0x20);
  tmp._40_8_ = *(undefined8 *)(pmVar5->randbytes + 0x28);
  tmp._48_8_ = *(undefined8 *)(pmVar5->randbytes + 0x30);
  tmp._56_8_ = *(undefined8 *)(pmVar5->randbytes + 0x38);
  uVar8 = *(undefined8 *)(pmVar5->randbytes + 0x28);
  uVar9 = *(undefined8 *)(pmVar5->randbytes + 0x30);
  uVar10 = *(undefined8 *)(pmVar5->randbytes + 0x38);
  *(undefined8 *)pmVar5->randbytes = *(undefined8 *)(pmVar5->randbytes + 0x20);
  *(undefined8 *)(pmVar5->randbytes + 8) = uVar8;
  *(undefined8 *)(pmVar5->randbytes + 0x10) = uVar9;
  *(undefined8 *)(pmVar5->randbytes + 0x18) = uVar10;
  *(undefined8 *)(pmVar5->randbytes + 0x20) = tmp._0_8_;
  *(undefined8 *)(pmVar5->randbytes + 0x28) = tmp._8_8_;
  *(undefined8 *)(pmVar5->randbytes + 0x30) = tmp._16_8_;
  *(undefined8 *)(pmVar5->randbytes + 0x38) = tmp._24_8_;
  mbedtls_zeroize(tmp,0x40);
  buf = pmVar4->master;
  iVar12 = (*pmVar5->tls_prf)(buf,0x30,"key expansion",puVar1,0x40,keyblk,0x100);
  if (iVar12 == 0) {
    pcVar19 = mbedtls_ssl_get_ciphersuite_name(pmVar4->ciphersuite);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x29b,"ciphersuite = %s",pcVar19);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x29c,"master secret",buf,0x30);
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x29d,"random bytes",puVar1,0x40);
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x29e,"key block",keyblk,0x100);
    mbedtls_zeroize(puVar1,0x40);
    pmVar6->keylen = cipher_info->key_bitlen >> 3;
    if ((cipher_info->mode == MBEDTLS_MODE_CCM) || (cipher_info->mode == MBEDTLS_MODE_GCM)) {
      pmVar6->maclen = 0;
      pmVar6->ivlen = 0xc;
      pmVar6->fixed_ivlen = 4;
      uVar18 = (ulong)((pmVar6->ciphersuite_info->flags & 2) == 0) * 8 + 0x10;
      pmVar6->minlen = uVar18;
      uVar17 = 0xc;
      uVar15 = 0;
    }
    else {
      iVar12 = mbedtls_md_setup(&pmVar6->md_ctx_enc,md_info,1);
      if ((iVar12 != 0) || (iVar12 = mbedtls_md_setup(&pmVar6->md_ctx_dec,md_info,1), iVar12 != 0))
      {
        pcVar19 = "mbedtls_md_setup";
        line = 699;
        goto LAB_001102e4;
      }
      bVar11 = mbedtls_md_get_size(md_info);
      uVar15 = 10;
      if (pmVar4->trunc_hmac != 1) {
        uVar15 = (ulong)bVar11;
      }
      pmVar6->maclen = uVar15;
      uVar17 = (ulong)cipher_info->iv_size;
      pmVar6->ivlen = uVar17;
      if (cipher_info->mode == MBEDTLS_MODE_STREAM) {
        pmVar6->minlen = uVar15;
        uVar18 = uVar15;
      }
      else {
        uVar18 = uVar15 + cipher_info->block_size;
        if (pmVar4->encrypt_then_mac != 1) {
          uVar18 = uVar18 - uVar15 % (ulong)cipher_info->block_size;
        }
        pmVar6->minlen = uVar18;
        if (1 < (uint)ssl->minor_ver) {
          if (1 < ssl->minor_ver - 2U) {
            iVar12 = 0x2f7;
            goto LAB_00110444;
          }
          uVar18 = uVar18 + uVar17;
          pmVar6->minlen = uVar18;
        }
      }
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x2ff,"keylen: %d, minlen: %d, ivlen: %d, maclen: %d",(ulong)pmVar6->keylen,uVar18,
               uVar17,uVar15);
    uVar14 = *(uint *)&ssl->conf->field_0x174 & 1;
    sVar16 = pmVar6->maclen;
    puVar20 = keyblk + sVar16 * 2;
    uVar3 = pmVar6->keylen;
    puVar1 = puVar20 + uVar3;
    key_00 = keyblk + sVar16;
    key_02 = puVar20;
    key = keyblk;
    key_01 = puVar1;
    if (uVar14 != 0) {
      key_02 = puVar1;
      key = key_00;
      key_00 = keyblk;
      key_01 = puVar20;
    }
    __n = pmVar6->fixed_ivlen;
    if (__n == 0) {
      __n = pmVar6->ivlen;
    }
    memcpy(pmVar6->iv_enc + (uVar14 << 4),puVar1 + uVar3,__n);
    memcpy(pmVar6->iv_enc + (ulong)(uVar14 == 0) * 0x10,puVar1 + uVar3 + __n,__n);
    if (ssl->minor_ver < 1) {
      iVar12 = 0x349;
LAB_00110444:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,iVar12,"should never happen");
      return -0x6c00;
    }
    mbedtls_md_hmac_starts(&pmVar6->md_ctx_enc,key,sVar16);
    mbedtls_md_hmac_starts(&pmVar6->md_ctx_dec,key_00,pmVar6->maclen);
    p_Var7 = ssl->conf->f_export_keys;
    if (p_Var7 != (_func_int_void_ptr_uchar_ptr_uchar_ptr_size_t_size_t_size_t *)0x0) {
      (*p_Var7)(ssl->conf->p_export_keys,buf,keyblk,pmVar6->maclen,(size_t)pmVar6->keylen,__n);
    }
    ctx = &pmVar6->cipher_ctx_enc;
    iVar12 = mbedtls_cipher_setup(ctx,cipher_info);
    if (iVar12 == 0) {
      ctx_00 = &pmVar6->cipher_ctx_dec;
      iVar12 = mbedtls_cipher_setup(ctx_00,cipher_info);
      if (iVar12 == 0) {
        iVar12 = mbedtls_cipher_setkey(ctx,key_02,cipher_info->key_bitlen,MBEDTLS_ENCRYPT);
        if (iVar12 == 0) {
          iVar12 = mbedtls_cipher_setkey(ctx_00,key_01,cipher_info->key_bitlen,MBEDTLS_DECRYPT);
          if (iVar12 == 0) {
            if (cipher_info->mode != MBEDTLS_MODE_CBC) {
LAB_001109fd:
              mbedtls_zeroize(keyblk,0x100);
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x3bd,"<= derive keys");
              return 0;
            }
            iVar12 = mbedtls_cipher_set_padding_mode(ctx,MBEDTLS_PADDING_NONE);
            if (iVar12 == 0) {
              iVar12 = mbedtls_cipher_set_padding_mode(ctx_00,MBEDTLS_PADDING_NONE);
              if (iVar12 == 0) goto LAB_001109fd;
              pcVar19 = "mbedtls_cipher_set_padding_mode";
              line = 0x395;
            }
            else {
              pcVar19 = "mbedtls_cipher_set_padding_mode";
              line = 0x38e;
            }
          }
          else {
            pcVar19 = "mbedtls_cipher_setkey";
            line = 900;
          }
        }
        else {
          pcVar19 = "mbedtls_cipher_setkey";
          line = 0x37c;
        }
      }
      else {
        pcVar19 = "mbedtls_cipher_setup";
        line = 0x374;
      }
    }
    else {
      pcVar19 = "mbedtls_cipher_setup";
      line = 0x36d;
    }
  }
  else {
    pcVar19 = "prf";
    line = 0x296;
  }
LAB_001102e4:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,line,pcVar19,iVar12);
  return iVar12;
}

Assistant:

int mbedtls_ssl_derive_keys( mbedtls_ssl_context *ssl )
{
    int ret = 0;
    unsigned char tmp[64];
    unsigned char keyblk[256];
    unsigned char *key1;
    unsigned char *key2;
    unsigned char *mac_enc;
    unsigned char *mac_dec;
    size_t iv_copy_len;
    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;

    mbedtls_ssl_session *session = ssl->session_negotiate;
    mbedtls_ssl_transform *transform = ssl->transform_negotiate;
    mbedtls_ssl_handshake_params *handshake = ssl->handshake;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> derive keys" ) );

    cipher_info = mbedtls_cipher_info_from_type( transform->ciphersuite_info->cipher );
    if( cipher_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "cipher info for %d not found",
                            transform->ciphersuite_info->cipher ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    md_info = mbedtls_md_info_from_type( transform->ciphersuite_info->mac );
    if( md_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "mbedtls_md info for %d not found",
                            transform->ciphersuite_info->mac ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /*
     * Set appropriate PRF function and other SSL / TLS / TLS1.2 functions
     */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        handshake->tls_prf = ssl3_prf;
        handshake->calc_verify = ssl_calc_verify_ssl;
        handshake->calc_finished = ssl_calc_finished_ssl;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls1_prf;
        handshake->calc_verify = ssl_calc_verify_tls;
        handshake->calc_finished = ssl_calc_finished_tls;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA512_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 &&
        transform->ciphersuite_info->mac == MBEDTLS_MD_SHA384 )
    {
        handshake->tls_prf = tls_prf_sha384;
        handshake->calc_verify = ssl_calc_verify_tls_sha384;
        handshake->calc_finished = ssl_calc_finished_tls_sha384;
    }
    else
#endif
#if defined(MBEDTLS_SHA256_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls_prf_sha256;
        handshake->calc_verify = ssl_calc_verify_tls_sha256;
        handshake->calc_finished = ssl_calc_finished_tls_sha256;
    }
    else
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /*
     * SSLv3:
     *   master =
     *     MD5( premaster + SHA1( 'A'   + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'BB'  + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'CCC' + premaster + randbytes ) )
     *
     * TLSv1+:
     *   master = PRF( premaster, "master secret", randbytes )[0..47]
     */
    if( handshake->resume == 0 )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "premaster secret", handshake->premaster,
                       handshake->pmslen );

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
        if( ssl->handshake->extended_ms == MBEDTLS_SSL_EXTENDED_MS_ENABLED )
        {
            unsigned char session_hash[48];
            size_t hash_len;

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "using extended master secret" ) );

            ssl->handshake->calc_verify( ssl, session_hash );

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
#if defined(MBEDTLS_SHA512_C)
                if( ssl->transform_negotiate->ciphersuite_info->mac ==
                    MBEDTLS_MD_SHA384 )
                {
                    hash_len = 48;
                }
                else
#endif
                    hash_len = 32;
            }
            else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
                hash_len = 36;

            MBEDTLS_SSL_DEBUG_BUF( 3, "session hash", session_hash, hash_len );

            ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                      "extended master secret",
                                      session_hash, hash_len,
                                      session->master, 48 );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
                return( ret );
            }

        }
        else
#endif
        ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                  "master secret",
                                  handshake->randbytes, 64,
                                  session->master, 48 );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
            return( ret );
        }

        mbedtls_zeroize( handshake->premaster, sizeof(handshake->premaster) );
    }
    else
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "no premaster (session resumed)" ) );

    /*
     * Swap the client and server random values.
     */
    memcpy( tmp, handshake->randbytes, 64 );
    memcpy( handshake->randbytes, tmp + 32, 32 );
    memcpy( handshake->randbytes + 32, tmp, 32 );
    mbedtls_zeroize( tmp, sizeof( tmp ) );

    /*
     *  SSLv3:
     *    key block =
     *      MD5( master + SHA1( 'A'    + master + randbytes ) ) +
     *      MD5( master + SHA1( 'BB'   + master + randbytes ) ) +
     *      MD5( master + SHA1( 'CCC'  + master + randbytes ) ) +
     *      MD5( master + SHA1( 'DDDD' + master + randbytes ) ) +
     *      ...
     *
     *  TLSv1:
     *    key block = PRF( master, "key expansion", randbytes )
     */
    ret = handshake->tls_prf( session->master, 48, "key expansion",
                              handshake->randbytes, 64, keyblk, 256 );
    if( ret != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite = %s",
                   mbedtls_ssl_get_ciphersuite_name( session->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_BUF( 3, "master secret", session->master, 48 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "random bytes", handshake->randbytes, 64 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "key block", keyblk, 256 );

    mbedtls_zeroize( handshake->randbytes, sizeof( handshake->randbytes ) );

    /*
     * Determine the appropriate key, IV and MAC length.
     */

    transform->keylen = cipher_info->key_bitlen / 8;

    if( cipher_info->mode == MBEDTLS_MODE_GCM ||
        cipher_info->mode == MBEDTLS_MODE_CCM )
    {
        transform->maclen = 0;

        transform->ivlen = 12;
        transform->fixed_ivlen = 4;

        /* Minimum length is expicit IV + tag */
        transform->minlen = transform->ivlen - transform->fixed_ivlen
                            + ( transform->ciphersuite_info->flags &
                                MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16 );
    }
    else
    {
        /* Initialize HMAC contexts */
        if( ( ret = mbedtls_md_setup( &transform->md_ctx_enc, md_info, 1 ) ) != 0 ||
            ( ret = mbedtls_md_setup( &transform->md_ctx_dec, md_info, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
            return( ret );
        }

        /* Get MAC length */
        transform->maclen = mbedtls_md_get_size( md_info );

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
        /*
         * If HMAC is to be truncated, we shall keep the leftmost bytes,
         * (rfc 6066 page 13 or rfc 2104 section 4),
         * so we only need to adjust the length here.
         */
        if( session->trunc_hmac == MBEDTLS_SSL_TRUNC_HMAC_ENABLED )
            transform->maclen = MBEDTLS_SSL_TRUNCATED_HMAC_LEN;
#endif /* MBEDTLS_SSL_TRUNCATED_HMAC */

        /* IV length */
        transform->ivlen = cipher_info->iv_size;

        /* Minimum length */
        if( cipher_info->mode == MBEDTLS_MODE_STREAM )
            transform->minlen = transform->maclen;
        else
        {
            /*
             * GenericBlockCipher:
             * 1. if EtM is in use: one block plus MAC
             *    otherwise: * first multiple of blocklen greater than maclen
             * 2. IV except for SSL3 and TLS 1.0
             */
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
            if( session->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED )
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size;
            }
            else
#endif
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size
                                  - transform->maclen % cipher_info->block_size;
            }

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_1 )
                ; /* No need to adjust minlen */
            else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_2 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
                transform->minlen += transform->ivlen;
            }
            else
#endif
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "keylen: %d, minlen: %d, ivlen: %d, maclen: %d",
                   transform->keylen, transform->minlen, transform->ivlen,
                   transform->maclen ) );

    /*
     * Finally setup the cipher contexts, IVs and MAC secrets.
     */
#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        key1 = keyblk + transform->maclen * 2;
        key2 = keyblk + transform->maclen * 2 + transform->keylen;

        mac_enc = keyblk;
        mac_dec = keyblk + transform->maclen;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_enc, key2 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_dec, key2 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        key1 = keyblk + transform->maclen * 2 + transform->keylen;
        key2 = keyblk + transform->maclen * 2;

        mac_enc = keyblk + transform->maclen;
        mac_dec = keyblk;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_dec, key1 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_enc, key1 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_SRV_C */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( transform->maclen > sizeof transform->mac_enc )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        memcpy( transform->mac_enc, mac_enc, transform->maclen );
        memcpy( transform->mac_dec, mac_dec, transform->maclen );
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 )
    {
        mbedtls_md_hmac_starts( &transform->md_ctx_enc, mac_enc, transform->maclen );
        mbedtls_md_hmac_starts( &transform->md_ctx_dec, mac_dec, transform->maclen );
    }
    else
#endif
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_init != NULL )
    {
        int ret = 0;

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_init()" ) );

        if( ( ret = mbedtls_ssl_hw_record_init( ssl, key1, key2, transform->keylen,
                                        transform->iv_enc, transform->iv_dec,
                                        iv_copy_len,
                                        mac_enc, mac_dec,
                                        transform->maclen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_init", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */

#if defined(MBEDTLS_SSL_EXPORT_KEYS)
    if( ssl->conf->f_export_keys != NULL )
    {
        ssl->conf->f_export_keys( ssl->conf->p_export_keys,
                                  session->master, keyblk,
                                  transform->maclen, transform->keylen,
                                  iv_copy_len );
    }
#endif

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_enc,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_dec,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_enc, key1,
                               cipher_info->key_bitlen,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_dec, key2,
                               cipher_info->key_bitlen,
                               MBEDTLS_DECRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_enc,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }

        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_dec,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    mbedtls_zeroize( keyblk, sizeof( keyblk ) );

#if defined(MBEDTLS_ZLIB_SUPPORT)
    // Initialize compression
    //
    if( session->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ssl->compress_buf == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Allocating compression buffer" ) );
            ssl->compress_buf = mbedtls_calloc( 1, MBEDTLS_SSL_BUFFER_LEN );
            if( ssl->compress_buf == NULL )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                                    MBEDTLS_SSL_BUFFER_LEN ) );
                return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
            }
        }

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "Initializing zlib states" ) );

        memset( &transform->ctx_deflate, 0, sizeof( transform->ctx_deflate ) );
        memset( &transform->ctx_inflate, 0, sizeof( transform->ctx_inflate ) );

        if( deflateInit( &transform->ctx_deflate,
                         Z_DEFAULT_COMPRESSION )   != Z_OK ||
            inflateInit( &transform->ctx_inflate ) != Z_OK )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "Failed to initialize compression" ) );
            return( MBEDTLS_ERR_SSL_COMPRESSION_FAILED );
        }
    }
#endif /* MBEDTLS_ZLIB_SUPPORT */

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= derive keys" ) );

    return( 0 );
}